

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::interval_t,duckdb::interval_t,duckdb::NotEquals,false,true,false,true>
                (interval_t *ldata,interval_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  int iVar1;
  unsigned_long *puVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  sel_t sVar8;
  int64_t *piVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  
  if (count + 0x3f < 0x40) {
    lVar16 = 0;
  }
  else {
    puVar2 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    lVar16 = 0;
    uVar6 = 0;
    uVar11 = 0;
    do {
      uVar18 = uVar6;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar15 = uVar6 + 0x40;
        if (count <= uVar6 + 0x40) {
          uVar15 = count;
        }
LAB_01474586:
        if (uVar6 < uVar15) {
          psVar3 = sel->sel_vector;
          iVar1 = rdata->months;
          iVar12 = rdata->days;
          lVar5 = rdata->micros;
          psVar4 = false_sel->sel_vector;
          lVar10 = lVar5 / 86400000000 + (long)iVar12;
          piVar9 = &ldata[uVar6].micros;
          do {
            uVar18 = uVar6;
            if (psVar3 != (sel_t *)0x0) {
              uVar18 = (ulong)psVar3[uVar6];
            }
            lVar7 = *piVar9;
            uVar17 = 1;
            if ((*(int32_t *)((long)piVar9 + -4) != iVar12 ||
                ((interval_t *)(piVar9 + -1))->months != iVar1) || lVar7 != lVar5) {
              lVar13 = (long)*(int32_t *)((long)piVar9 + -4) + lVar7 / 86400000000;
              if ((long)((interval_t *)(piVar9 + -1))->months + lVar13 / 0x1e ==
                  lVar10 / 0x1e + (long)iVar1) {
                uVar17 = 0;
                if (lVar13 % 0x1e == lVar10 % 0x1e) {
                  uVar17 = (ulong)(lVar7 % 86400000000 == lVar5 % 86400000000);
                }
              }
              else {
                uVar17 = 0;
              }
            }
            psVar4[lVar16] = (sel_t)uVar18;
            lVar16 = uVar17 + lVar16;
            uVar6 = uVar6 + 1;
            piVar9 = piVar9 + 2;
            uVar18 = uVar15;
          } while (uVar15 != uVar6);
        }
      }
      else {
        uVar17 = puVar2[uVar11];
        uVar15 = uVar6 + 0x40;
        if (count <= uVar6 + 0x40) {
          uVar15 = count;
        }
        if (uVar17 == 0xffffffffffffffff) goto LAB_01474586;
        if (uVar17 == 0) {
          uVar18 = uVar15;
          if (uVar6 < uVar15) {
            psVar3 = sel->sel_vector;
            psVar4 = false_sel->sel_vector;
            do {
              sVar8 = (sel_t)uVar6;
              if (psVar3 != (sel_t *)0x0) {
                sVar8 = psVar3[uVar6];
              }
              psVar4[lVar16] = sVar8;
              lVar16 = lVar16 + 1;
              uVar6 = uVar6 + 1;
            } while (uVar15 != uVar6);
          }
        }
        else if (uVar6 < uVar15) {
          psVar3 = sel->sel_vector;
          psVar4 = false_sel->sel_vector;
          piVar9 = &ldata[uVar6].micros;
          uVar14 = 0;
          do {
            if (psVar3 == (sel_t *)0x0) {
              sVar8 = (int)uVar6 + (int)uVar14;
            }
            else {
              sVar8 = psVar3[uVar6 + uVar14];
            }
            uVar18 = 1;
            if ((uVar17 >> (uVar14 & 0x3f) & 1) != 0) {
              iVar1 = *(int32_t *)((long)piVar9 + -4);
              lVar5 = *piVar9;
              lVar10 = rdata->micros;
              iVar12 = rdata->days;
              if ((rdata->days != iVar1 || rdata->months != ((interval_t *)(piVar9 + -1))->months)
                 || (iVar12 = iVar1, lVar5 != lVar10)) {
                lVar7 = (long)iVar1 + lVar5 / 86400000000;
                lVar13 = (long)iVar12 + lVar10 / 86400000000;
                if ((long)((interval_t *)(piVar9 + -1))->months + lVar7 / 0x1e ==
                    (long)rdata->months + lVar13 / 0x1e) {
                  uVar18 = 0;
                  if (lVar7 % 0x1e == lVar13 % 0x1e) {
                    uVar18 = (ulong)(lVar5 % 86400000000 == lVar10 % 86400000000);
                  }
                }
                else {
                  uVar18 = 0;
                }
              }
            }
            psVar4[lVar16] = sVar8;
            lVar16 = uVar18 + lVar16;
            uVar14 = uVar14 + 1;
            piVar9 = piVar9 + 2;
            uVar18 = uVar15;
          } while (uVar15 - uVar6 != uVar14);
        }
      }
      uVar6 = uVar18;
      uVar11 = uVar11 + 1;
    } while (uVar11 != count + 0x3f >> 6);
  }
  return count - lVar16;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}